

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::rescaleVar(Projection *this,MultiFab *sig,int param_2,MultiFab *vel,int level)

{
  int iVar1;
  int iVar2;
  pointer pGVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int iVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  Box local_114;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  Array4<double> local_d0;
  MFIter mfi;
  long lVar18;
  
  pGVar3 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar22 = *(int *)((long)(pGVar3 + level) + 0xac);
  iVar1 = *(int *)((long)(pGVar3 + level) + 0xb0);
  iVar24 = *(int *)((long)(pGVar3 + level) + 0xb8);
  iVar2 = *(int *)((long)(pGVar3 + level) + 0xbc);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)sig,true);
  auVar14._0_8_ = (long)iVar22;
  auVar14._8_4_ = iVar22;
  auVar14._12_4_ = iVar22 >> 0x1f;
  auVar12._0_8_ = (long)iVar24;
  auVar12._8_4_ = iVar24;
  auVar12._12_4_ = iVar24 >> 0x1f;
  local_e8 = auVar14 ^ _DAT_00606240;
  local_f8 = auVar12 ^ _DAT_00606240;
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::growntilebox(&local_114,&mfi,-1000000);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,&sig->super_FabArray<amrex::FArrayBox>,&mfi);
    auVar14 = _DAT_00601800;
    auVar12 = _DAT_006017f0;
    lVar8 = (long)local_114.smallend.vect[2];
    uVar6 = local_114.bigend.vect[0] - local_114.smallend.vect[0];
    auVar20._0_8_ = (long)local_114.smallend.vect[0];
    auVar20._8_4_ = local_114.smallend.vect[0];
    auVar20._12_4_ = local_114.smallend.vect[0] >> 0x1f;
    auVar13._0_8_ = auVar20._0_8_ + (long)DAT_006017f0;
    auVar13._8_8_ = auVar20._8_8_ + DAT_006017f0._8_8_;
    auVar15._4_4_ = 0;
    auVar15._0_4_ = uVar6;
    auVar15._8_4_ = uVar6;
    auVar15._12_4_ = 0;
    lVar9 = (long)local_d0.p +
            ((long)local_114.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 8 +
            (lVar8 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_114.smallend.vect[0] * 8
            + (long)local_d0.begin.x * -8 + 8;
    auVar15 = auVar15 ^ _DAT_00601800;
    for (; lVar7 = (long)local_114.smallend.vect[1], lVar11 = lVar9,
        lVar8 <= local_114.bigend.vect[2]; lVar8 = lVar8 + 1) {
      for (; lVar7 <= local_114.bigend.vect[1]; lVar7 = lVar7 + 1) {
        if (local_114.smallend.vect[0] <= local_114.bigend.vect[0]) {
          bVar5 = iVar2 < lVar7;
          bVar4 = lVar7 < iVar1;
          auVar16._9_7_ = 0;
          auVar16._0_9_ = CONCAT18(bVar5,(ulong)bVar5) | CONCAT18(bVar4,(ulong)bVar4);
          uVar10 = 0;
          auVar17 = auVar13;
          do {
            auVar28._8_4_ = (int)uVar10;
            auVar28._0_8_ = uVar10;
            auVar28._12_4_ = (int)(uVar10 >> 0x20);
            auVar20 = (auVar28 | auVar12) ^ auVar14;
            auVar19._0_4_ = -(uint)(auVar15._0_4_ < auVar20._0_4_);
            auVar19._4_4_ = -(uint)(auVar15._4_4_ < auVar20._4_4_);
            auVar19._8_4_ = -(uint)(auVar15._8_4_ < auVar20._8_4_);
            auVar19._12_4_ = -(uint)(auVar15._12_4_ < auVar20._12_4_);
            auVar35._4_4_ = auVar19._0_4_;
            auVar35._0_4_ = auVar19._0_4_;
            auVar35._8_4_ = auVar19._8_4_;
            auVar35._12_4_ = auVar19._8_4_;
            auVar21._4_4_ = -(uint)(auVar20._4_4_ == auVar15._4_4_);
            auVar21._12_4_ = -(uint)(auVar20._12_4_ == auVar15._12_4_);
            auVar21._0_4_ = auVar21._4_4_;
            auVar21._8_4_ = auVar21._12_4_;
            auVar20 = auVar17 ^ _DAT_00606240;
            iVar26 = -(uint)(auVar20._0_4_ < (int)local_e8._0_4_);
            iVar22 = auVar20._4_4_;
            iVar29 = -(uint)(auVar20._8_4_ < (int)local_e8._8_4_);
            iVar24 = auVar20._12_4_;
            auVar30._4_4_ = iVar26;
            auVar30._0_4_ = iVar26;
            auVar30._8_4_ = iVar29;
            auVar30._12_4_ = iVar29;
            auVar33._4_4_ = -(uint)(local_e8._4_4_ == iVar22);
            auVar33._12_4_ = -(uint)(local_e8._12_4_ == iVar24);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar31._4_4_ = -(uint)(iVar22 < (int)local_e8._4_4_);
            auVar31._0_4_ = -(uint)(iVar22 < (int)local_e8._4_4_);
            auVar31._8_4_ = -(uint)(iVar24 < (int)local_e8._12_4_);
            auVar31._12_4_ = -(uint)(iVar24 < (int)local_e8._12_4_);
            auVar32 = auVar31 | auVar33 & auVar30;
            iVar26 = -(uint)((int)local_f8._0_4_ < auVar20._0_4_);
            auVar27._4_4_ = -(uint)((int)local_f8._4_4_ < iVar22);
            iVar29 = -(uint)((int)local_f8._8_4_ < auVar20._8_4_);
            auVar27._12_4_ = -(uint)((int)local_f8._12_4_ < iVar24);
            auVar34._4_4_ = iVar26;
            auVar34._0_4_ = iVar26;
            auVar34._8_4_ = iVar29;
            auVar34._12_4_ = iVar29;
            auVar36._4_4_ = -(uint)(iVar22 == local_f8._4_4_);
            auVar36._0_4_ = -(uint)(iVar22 == local_f8._4_4_);
            auVar36._8_4_ = -(uint)(iVar24 == local_f8._12_4_);
            auVar36._12_4_ = -(uint)(iVar24 == local_f8._12_4_);
            auVar25._4_4_ = auVar19._4_4_;
            auVar25._0_4_ = auVar19._4_4_;
            auVar25._8_4_ = auVar19._12_4_;
            auVar25._12_4_ = auVar19._12_4_;
            auVar20 = auVar35 & auVar21 | auVar25;
            auVar27._0_4_ = auVar27._4_4_;
            auVar27._8_4_ = auVar27._12_4_;
            auVar28 = auVar27 | auVar36 & auVar34 | auVar32 | auVar16;
            auVar35 = (auVar20 | auVar28) ^ _DAT_00606220;
            if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)(lVar11 + -8 + uVar10 * 8);
            }
            if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar32._8_8_ = *(undefined8 *)(lVar11 + uVar10 * 8);
            }
            auVar35 = divpd(_DAT_00601290,auVar32);
            auVar37._0_8_ = -(ulong)(1e-200 < ABS(auVar32._0_8_)) & auVar35._0_8_;
            auVar37._8_8_ = -(ulong)(1e-200 < ABS(auVar32._8_8_)) & auVar35._8_8_;
            auVar28 = ~auVar20 & auVar28;
            iVar22 = auVar28._0_4_;
            iVar24 = auVar28._8_4_;
            auVar23._0_4_ = (iVar22 << 0x1f) >> 0x1f;
            auVar23._4_4_ = (iVar22 << 0x1f) >> 0x1f;
            auVar23._8_4_ = (iVar24 << 0x1f) >> 0x1f;
            auVar23._12_4_ = (iVar24 << 0x1f) >> 0x1f;
            auVar28 = auVar23 & _DAT_00608b30 | ~auVar23 & auVar37;
            if ((~auVar20._0_4_ & 1) != 0) {
              *(long *)(lVar11 + -8 + uVar10 * 8) = auVar28._0_8_;
            }
            if ((((auVar21 & auVar19 | auVar25) ^ _DAT_00606220) & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) {
              *(long *)(lVar11 + uVar10 * 8) = auVar28._8_8_;
            }
            uVar10 = uVar10 + 2;
            lVar18 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 2;
            auVar17._8_8_ = lVar18 + 2;
          } while (((ulong)uVar6 + 2 & 0xfffffffffffffffe) != uVar10);
        }
        lVar11 = lVar11 + local_d0.jstride * 8;
      }
      lVar9 = lVar9 + local_d0.kstride * 8;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
Projection::rescaleVar (MultiFab*       sig,
                        int             /*sig_nghosts*/,
                        MultiFab*       vel,
                        int             level)
{
    AMREX_ASSERT(sig->nComp() == 1);
    AMREX_ASSERT(vel->nComp() >= AMREX_SPACEDIM);

    const Box& domain  = parent->Geom(level).Domain();
    const int  domlox  = domain.smallEnd(0);
    const int  domloy  = domain.smallEnd(1);
    const int  domhix  = domain.bigEnd(0);
    const int  domhiy  = domain.bigEnd(1);

#if (AMREX_SPACEDIM  == 2)

    if (parent->Geom(0).IsRZ())
    {
        //
        // Divide sigma and vel by a radius for r-z coordinates.
        // Invert sigma to return to original form
        //
	const Real dxr     = parent->Geom(level).CellSize()[0];

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
	for (MFIter mfi(*sig,TilingIfNotGPU()); mfi.isValid(); ++mfi)
	{
	  const Box& bx = mfi.growntilebox();
	  auto const& sigarr = sig->array(mfi);

	  amrex::ParallelFor(bx, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      // Don't think we need this check for small sigma since RZ
	      // doesn't work with EB in MLNodeLap. The concern is covered vals == 0
	      // if ( amrex::Math::abs(sigarr(i,j,k)) > SmallValue ) ?
	      sigarr(i,j,k) = (static_cast<Real>(i)+ Real(0.5))*dxr/sigarr(i,j,k);
	      // : sigarr(i,j,k) = 0.;
	    }
	    else
	    {
	      // set vals outside the domain to bogus_value
	      sigarr(i,j,k) = BogusValue;
	    }
	  });

	  auto const& velarr = vel->array(mfi);

	  amrex::ParallelFor(bx, AMREX_SPACEDIM, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      velarr(i,j,k,n) /= (static_cast<Real>(i)+ Real(0.5))*dxr;
	    }
	    else
	    {
	      // set vals outside the domain
	      velarr(i,j,k,n) = BogusValue;
	    }
	  });
	}
    }
    else
#endif
    {
        //
        // Invert sigma
        //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
	for (MFIter mfi(*sig,TilingIfNotGPU()); mfi.isValid(); ++mfi)
	{
	  const Box& bx = mfi.growntilebox();
	  auto const& sigarr = sig->array(mfi);

	  amrex::ParallelFor(bx, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      // The conern here is EB covered cells set to zero
	      sigarr(i,j,k) = ( amrex::Math::abs(sigarr(i,j,k)) > SmallValue )
		? Real(1.0)/sigarr(i,j,k)
		: sigarr(i,j,k) = 0.;
	    }
	    else
	    {
	      // set vals outside the domain to
	      sigarr(i,j,k) = BogusValue;
	    }
	  });
	}
    }
}